

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O2

vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
* __thiscall
ising::dos::square::finite<128u,100u,int>
          (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
           *__return_storage_ptr__,square *this,uint_t m,uint_t n)

{
  bool bVar1;
  uint uVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnVar3;
  undefined4 *puVar4;
  uint n_00;
  long lVar5;
  ulong uVar6;
  data_type *__init;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *x_00;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *x_01;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *x_02;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *x_03;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *x_04;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *x_05;
  cpp_dec_float<100U,_int,_void> *this_00;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *x_06;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *x_07;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  *__return_storage_ptr___00;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  *this_01;
  uint j;
  square *psVar7;
  ulong uVar8;
  data_type dStack_37788;
  undefined4 uStack_37778;
  undefined2 uStack_37774;
  undefined1 uStack_37772;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  nStack_37768;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  zmn;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  sum;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  pStack_32678;
  cpp_dec_float<100U,_int,_void> acStack_2fe28 [129];
  data_type dStack_2d5d8;
  undefined4 uStack_2d5c8;
  undefined2 uStack_2d5c4;
  undefined1 uStack_2d5c2;
  undefined1 auStack_2ad80 [16];
  type_conflict5 tStack_2ad70;
  type_conflict5 tStack_2ad68;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z4;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z3;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z2;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z1;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  beta_m;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_128UL>
  x;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  ak;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_128UL>
  xmo;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  sn;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  cn;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  s0;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  c0;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  beta;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  local_7920;
  cpp_dec_float<100U,_int,_void> local_50d0 [129];
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_128UL>
  xpo;
  
  lVar5 = *(long *)(std::cout + -0x18);
  *(undefined8 *)(&std::bad_alloc::typeinfo + lVar5) = 0x80;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)&zmn,0,(type *)0x0);
  uVar2 = (uint)lVar5;
  boost::math::differentiation::autodiff_v1::
  make_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
            (&x,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                 *)&zmn);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)&zmn,-1,(type *)0x0);
  boost::math::differentiation::autodiff_v1::
  make_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
            (&xpo,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *)&zmn);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)&zmn,1,(type *)0x0);
  boost::math::differentiation::autodiff_v1::
  make_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
            (&xmo,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *)&zmn);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)&pStack_32678,2,(type *)0x0);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  ::operator*((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)&sum,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                       *)&x,(root_type *)&pStack_32678);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(&zmn,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                    *)&sum,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)&xpo);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(&beta,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                     *)&zmn,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)&xmo);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (&beta_m,(_anonymous_namespace_ *)&beta,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar2);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)&zmn,(_anonymous_namespace_ *)&xmo,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(&pStack_32678,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&x,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)&xpo);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)&sum,(_anonymous_namespace_ *)&pStack_32678,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(&c0,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&zmn,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)&sum);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)&zmn,(_anonymous_namespace_ *)&xmo,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(&pStack_32678,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&x,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)&xpo);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)&sum,(_anonymous_namespace_ *)&pStack_32678,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator-(&s0,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&zmn,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)&sum);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)&zmn,(_anonymous_namespace_ *)&xpo,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(&pStack_32678,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&x,&xmo);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)&sum,(_anonymous_namespace_ *)&pStack_32678,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(&cn,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&zmn,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)&sum);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)&zmn,(_anonymous_namespace_ *)&xpo,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(&pStack_32678,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&x,&xmo);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)&sum,(_anonymous_namespace_ *)&pStack_32678,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator-(&sn,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&zmn,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)&sum);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (&z1,(_anonymous_namespace_ *)&x,x_00);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (&z2,(_anonymous_namespace_ *)&x,x_01);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (&z3,(_anonymous_namespace_ *)&x,x_02);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (&z4,(_anonymous_namespace_ *)&x,x_03);
  if ((m & 1) == 0) {
    (anonymous_namespace)::
    one<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
              ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                *)&sum,(_anonymous_namespace_ *)&x,x_04);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)&pStack_32678,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&zmn.v,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&sum,(root_type *)&pStack_32678);
    std::
    array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_129UL>
    ::operator=(&z1.v,&zmn.v);
    (anonymous_namespace)::
    one<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
              ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                *)&sum,(_anonymous_namespace_ *)&x,x_05);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)&pStack_32678,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&zmn.v,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&sum,(root_type *)&pStack_32678);
    std::
    array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_129UL>
    ::operator=(&z2.v,&zmn.v);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
    ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                 *)&sum,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                         *)&c0,&cn);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)&pStack_32678,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&zmn.v,
                (promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                 *)&sum,(root_type *)&pStack_32678);
    std::
    array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_129UL>
    ::operator=(&z3.v,&zmn.v);
    __return_storage_ptr___00 =
         (promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
          *)&sum;
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
    ::operator*(__return_storage_ptr___00,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                 *)&s0,&sn);
    this_00 = (cpp_dec_float<100U,_int,_void> *)&pStack_32678;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (this_00,2,(type *)0x0);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)&sum,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&zmn.v,&cn,(root_type *)&sum);
    std::
    array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_129UL>
    ::operator=(&z1.v,&zmn.v);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)&sum,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&zmn.v,&sn,(root_type *)&sum);
    std::
    array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_129UL>
    ::operator=(&z2.v,&zmn.v);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)&sum,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&zmn.v,&c0,(root_type *)&sum);
    std::
    array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_129UL>
    ::operator=(&z3.v,&zmn.v);
    this_00 = (cpp_dec_float<100U,_int,_void> *)&sum;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (this_00,2,(type *)0x0);
    __return_storage_ptr___00 = &s0;
  }
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  ::operator/(&zmn,__return_storage_ptr___00,(root_type *)this_00);
  std::
  array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_129UL>
  ::operator=(&z4.v,&zmn.v);
  uVar2 = (int)this - 1;
  for (uVar8 = 1; uVar8 < m; uVar8 = (ulong)((type_conflict5)uVar8 + 1)) {
    pnVar3 = boost::math::constants::detail::
             constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
             ::get_from_string();
    acStack_2fe28[0].data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
    acStack_2fe28[0].data._M_elems._8_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 2);
    acStack_2fe28[0].data._M_elems._16_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 4);
    acStack_2fe28[0].data._M_elems._24_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 6);
    acStack_2fe28[0].data._M_elems._32_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 8);
    acStack_2fe28[0].data._M_elems._40_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 10);
    acStack_2fe28[0].data._M_elems._48_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 0xc)
    ;
    acStack_2fe28[0].data._M_elems._56_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 0xe)
    ;
    acStack_2fe28[0].exp = (pnVar3->m_backend).exp;
    acStack_2fe28[0].neg = (pnVar3->m_backend).neg;
    uVar6 = (ulong)CONCAT31((int3)((uint)acStack_2fe28[0].exp >> 8),acStack_2fe28[0].neg);
    acStack_2fe28[0].fpclass = (pnVar3->m_backend).fpclass;
    acStack_2fe28[0].prec_elem = (pnVar3->m_backend).prec_elem;
    psVar7 = (square *)0x0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (local_50d0,1,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
    ::operator*(&pStack_32678,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                 *)&x,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                       *)&x);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator+((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&sum,&pStack_32678,(root_type *)local_50d0);
    (anonymous_namespace)::
    power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
              ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                *)&zmn,(_anonymous_namespace_ *)&sum,
               (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                *)0x2,(uint)uVar6);
    auStack_2ad80._8_8_ = acStack_2fe28;
    auStack_2ad80._0_8_ = &dStack_2d5d8;
    tStack_2ad70 = (type_conflict5)uVar8;
    tStack_2ad68 = (type_conflict5)m;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    number<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_floating_pointcos_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>,boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,unsigned_int,void,void>,unsigned_int,void,void>,void,void>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_7920,
               (expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_floating_pointcos_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_unsigned_int,_void,_void>,_unsigned_int,_void,_void>,_void,_void>
                *)auStack_2ad80,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator*((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&dStack_2d5d8.ld,&beta,(root_type *)&local_7920);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
    ::operator-(&ak,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                     *)&zmn,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)&dStack_2d5d8.ld);
    (anonymous_namespace)::
    zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
              ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                *)&zmn,(_anonymous_namespace_ *)&x,x_06);
    x_07 = (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
            *)((ulong)this & 0xffffffff);
    while( true ) {
      n_00 = (uint)uVar6;
      if (this < psVar7) break;
      boost::math::
      binomial_coefficient<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                (&nStack_37768,(math *)((ulong)this & 0xffffffff),(uint)psVar7,n_00);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                   *)local_50d0,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&ak,&ak);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*(&local_7920,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&beta,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                            *)&beta);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator-((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                   *)acStack_2fe28,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)local_50d0,&local_7920);
      (anonymous_namespace)::
      power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
                ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                  *)&dStack_2d5d8.ld,(_anonymous_namespace_ *)acStack_2fe28,
                 (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                  *)((ulong)psVar7 >> 1),(uint)uVar6);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator*((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)&pStack_32678,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)&dStack_2d5d8.ld,&nStack_37768);
      (anonymous_namespace)::
      power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
                ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                  *)auStack_2ad80,(_anonymous_namespace_ *)&ak,x_07,(uint)uVar6);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                   *)&sum,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                           *)&pStack_32678,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)auStack_2ad80);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator+=((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                    *)&zmn,(promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                            *)&sum);
      psVar7 = (square *)(ulong)((uint)psVar7 + 2);
      x_07 = (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)(ulong)((int)x_07 - 2);
    }
    if ((uVar8 & 1) == 0) {
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator+(&pStack_32678,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&zmn,&beta_m);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (acStack_2fe28,2,(type *)0x0);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&dStack_2d5d8.ld,(_anonymous_namespace_ *)acStack_2fe28,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)(ulong)uVar2,n_00);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)&sum,&pStack_32678,(root_type *)&dStack_2d5d8.ld);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*=((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                    *)&z3,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                           *)&sum);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator-(&pStack_32678,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&zmn,&beta_m);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (acStack_2fe28,2,(type *)0x0);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&dStack_2d5d8.ld,(_anonymous_namespace_ *)acStack_2fe28,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)(ulong)uVar2,n_00);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)&sum,&pStack_32678,(root_type *)&dStack_2d5d8.ld);
      this_01 = (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                 *)&z4;
    }
    else {
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator+(&pStack_32678,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&zmn,&beta_m);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (acStack_2fe28,2,(type *)0x0);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&dStack_2d5d8.ld,(_anonymous_namespace_ *)acStack_2fe28,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)(ulong)uVar2,n_00);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)&sum,&pStack_32678,(root_type *)&dStack_2d5d8.ld);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*=((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                    *)&z1,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                           *)&sum);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator-(&pStack_32678,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&zmn,&beta_m);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (acStack_2fe28,2,(type *)0x0);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&dStack_2d5d8.ld,(_anonymous_namespace_ *)acStack_2fe28,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)(ulong)uVar2,n_00);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)&sum,&pStack_32678,(root_type *)&dStack_2d5d8.ld);
      this_01 = (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                 *)&z2;
    }
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
    ::operator*=(this_01,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                          *)&sum);
  }
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(&pStack_32678,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&z1,&z2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
               *)&sum,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                       *)&pStack_32678,&z3);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(&zmn,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                    *)&sum,&z4);
  (__return_storage_ptr__->
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar2 = 0; (ulong)uVar2 <= (long)this * m * 2; uVar2 = uVar2 + 1) {
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::at_cpp11<>((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                  *)&pStack_32678,&zmn,(ulong)uVar2);
    ak.v._M_elems[0].m_backend.data._M_elems[0] = 0x47ae147b;
    ak.v._M_elems[0].m_backend.data._M_elems[1] = 0x3f847ae1;
    boost::multiprecision::operator+
              ((type *)&sum,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&pStack_32678,(double *)&ak);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
    ::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                *)&dStack_2d5d8.ld,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&sum,(type *)0x0);
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>>
    ::
    emplace_back<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
              ((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>>
                *)__return_storage_ptr__,
               (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)&dStack_2d5d8.ld);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
               *)&dStack_2d5d8.ld);
  }
  __init = &dStack_37788;
  dStack_37788.la[0] = 0;
  uStack_37778 = 1;
  uStack_37774 = 0x100;
  uStack_37772 = 0;
  std::
  accumulate<__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>>>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            (&sum,(__return_storage_ptr__->
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
              *)&__init->ld);
  uVar2 = (uint)__init;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)&dStack_37788.ld);
  dStack_2d5d8.la[0] = 2;
  uStack_2d5c8 = 1;
  uStack_2d5c4 = 0x100;
  uStack_2d5c2 = 0;
  (anonymous_namespace)::
  power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
              *)&pStack_32678,(_anonymous_namespace_ *)&dStack_2d5d8.ld,
             (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
              *)(ulong)((type_conflict5)m * (int)this),uVar2);
  bVar1 = boost::multiprecision::operator!=
                    (&sum,(number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                           *)&pStack_32678);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)&pStack_32678);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)&dStack_2d5d8.ld);
  if (!bVar1) {
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number(&sum);
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cerr,"Error: result check failed\n");
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

std::vector<mp::cpp_int> finite(uint_t m, uint_t n) {
  typedef mp::number<mp::cpp_dec_float<Digits10, ExponentType>> real_type;
  std::cout << std::setprecision(std::numeric_limits<real_type>::max_digits10);

  auto const x = make_fvar<real_type, Order>(0);
  auto const xpo = make_fvar<real_type, Order>(-1);
  auto const xmo = make_fvar<real_type, Order>(+1);

  auto beta = 2 * x * xpo * xmo;
  auto beta_m = power_n(beta, m);
  auto c0 = power_n(xmo, m) + power_n(x * xpo, m);
  auto s0 = power_n(xmo, m) - power_n(x * xpo, m);
  auto cn = power_n(xpo, m) + power_n(x * xmo, m);
  auto sn = power_n(xpo, m) - power_n(x * xmo, m);

  auto z1 = zero(x);
  auto z2 = zero(x);
  auto z3 = zero(x);
  auto z4 = zero(x);
  if ((n & 1) == 0) {
    z1 = one(x) / 2;
    z2 = one(x) / 2;
    z3 = c0 * cn / 2;
    z4 = s0 * sn / 2;
  } else {
    z1 = cn / 2;
    z2 = sn / 2;
    z3 = c0 / 2;
    z4 = s0 / 2;
  }
  for (unsigned k = 1; k < n; ++k) {
    auto ak = alpha(x, beta, n, k);
    auto v = zero(x);
    for (unsigned j = 0; j <= m; j += 2)
      v += binomial_coefficient<real_type>(m, j)
        * power_n(ak * ak - beta * beta, j/2) * power_n(ak, m-j);
    if ((k & 1) == 1) {
      z1 *= (v + beta_m) / power_n(real_type(2), m - 1);
      z2 *= (v - beta_m) / power_n(real_type(2), m - 1);
    } else {
      z3 *= (v + beta_m) / power_n(real_type(2), m - 1);
      z4 *= (v - beta_m) / power_n(real_type(2), m - 1);
    }
  }
  auto zmn = z1 + z2 + z3 + z4;

  std::vector<int_type> dos;
  for (unsigned i = 0; i <= 2 * m * n; ++i) dos.push_back(int_type(zmn.at(i) + 0.01));
  auto sum = std::accumulate(dos.begin(), dos.end(), int_type(0));
  if (sum != power_n(int_type(2), m * n)) {
    std::cerr << "Error: result check failed\n";
    throw(0);
  }
  return dos;
}